

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::HttpServer::Connection::accept(Connection *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  SourceLocation location;
  int extraout_EAX;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_00;
  HttpHeaders *in_R8;
  StringPtr statusText;
  Fault f;
  Promise<void> promise;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_a0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  HttpOutputStream local_88;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *local_68;
  Array<char> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((this->currentMethod).ptr.isSet == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9a,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)&local_a0);
  }
  uVar1 = (this->currentMethod).ptr.field_1.value.tag;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=(&this->currentMethod);
  local_90.ptr._0_1_ = uVar1 == 2;
  if (!(bool)local_90.ptr._0_1_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              ((Fault *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9c,FAILED,"method.is<HttpConnectMethod>()",
               "_kjCondition,\"only use accept() with CONNECT requests\"",
               (DebugExpression<bool> *)&local_90,
               (char (*) [40])"only use accept() with CONNECT requests");
    kj::_::Debug::Fault::fatal((Fault *)&local_a0);
  }
  local_90.ptr._0_1_ = __fd - 200U < 100;
  if (!(bool)local_90.ptr._0_1_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[38]>
              ((Fault *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9d,FAILED,"statusCode >= 200 && statusCode < 300",
               "_kjCondition,\"the statusCode must be 2xx for accept\"",(bool *)&local_90,
               (char (*) [38])"the statusCode must be 2xx for accept");
    kj::_::Debug::Fault::fatal((Fault *)&local_a0);
  }
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=(&this->tunnelRejected);
  if ((this->tunnelWriteGuard).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
    local_48 = 0;
    uStack_40 = 0;
    statusText.content.size_ = (size_t)__addr_len;
    statusText.content.ptr = (char *)__addr;
    HttpHeaders::serializeResponse
              ((String *)&local_60,in_R8,__fd,statusText,(ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
    anon_unknown_36::HttpOutputStream::writeHeaders(&this->httpOutput,(String *)&local_60);
    Array<char>::~Array(&local_60);
    anon_unknown_36::HttpOutputStream::flush(&local_88);
    this_00 = &this->tunnelWriteGuard;
    local_68 = this_00;
    Promise<void>::
    then<kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>
              ((Promise<void> *)&local_a0,(anon_class_8_1_a7efefcd_for_func *)&local_88);
    local_88.inner = (AsyncOutputStream *)0x4d3fd6;
    local_88.writeQueue.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x4d6b7b;
    local_88.inBody = true;
    local_88.broken = true;
    local_88.writeInProgress = false;
    local_88._27_5_ = 0x1400;
    location.function = "accept";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1fa2;
    location.columnNumber = 0x14;
    Promise<void>::eagerlyEvaluate((Promise<void> *)&local_90,&local_a0,location);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88);
    Own<kj::PromiseFulfiller<void>,decltype(nullptr)>::attach<kj::Promise<void>>
              ((Own<kj::PromiseFulfiller<void>,decltype(nullptr)> *)&local_a0,
               (Promise<void> *)this_00);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=(&this_00->ptr,&local_a0);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_a0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
    return extraout_EAX;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
            ((Fault *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fa0,FAILED,"tunnelWriteGuard != nullptr",
             "\"the tunnel stream was not initialized\"",
             (char (*) [38])"the tunnel stream was not initialized");
  kj::_::Debug::Fault::fatal((Fault *)&local_a0);
}

Assistant:

void accept(uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;
    KJ_ASSERT(method.is<HttpConnectMethod>(), "only use accept() with CONNECT requests");
    KJ_REQUIRE(statusCode >= 200 && statusCode < 300, "the statusCode must be 2xx for accept");
    tunnelRejected = kj::none;

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    httpOutput.writeHeaders(headers.serializeResponse(statusCode, statusText));
    auto promise = httpOutput.flush().then([&fulfiller]() {
      fulfiller->fulfill();
    }).eagerlyEvaluate(nullptr);
    fulfiller = fulfiller.attach(kj::mv(promise));
  }